

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedPipelineStateImpl.cpp
# Opt level: O0

ShaderCreateInfo * __thiscall
Diligent::SerializedPipelineStateImpl::GetPatchedShaderCreateInfo
          (ShaderCreateInfo *__return_storage_ptr__,SerializedPipelineStateImpl *this,
          ARCHIVE_DEVICE_DATA_FLAGS DeviceType,Uint32 ShaderIndex)

{
  SerializedData *this_00;
  bool bVar1;
  PIPELINE_STATE_STATUS PVar2;
  DeviceType DVar3;
  Char *pCVar4;
  const_reference this_01;
  ulong uVar5;
  size_type sVar6;
  const_reference Data;
  char (*in_R8) [73];
  undefined1 local_e8 [8];
  string msg_2;
  undefined1 local_a8 [8];
  Serializer<(Diligent::SerializerMode)0> Ser_1;
  Serializer<(Diligent::SerializerMode)0> Ser;
  value_type *Shaders;
  undefined1 local_68 [4];
  DeviceType Type;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  Uint32 ShaderIndex_local;
  ARCHIVE_DEVICE_DATA_FLAGS DeviceType_local;
  SerializedPipelineStateImpl *this_local;
  
  msg.field_2._8_4_ = ShaderIndex;
  msg.field_2._12_4_ = DeviceType;
  PVar2 = std::atomic<Diligent::PIPELINE_STATE_STATUS>::load(&this->m_Status,memory_order_seq_cst);
  if (PVar2 != PIPELINE_STATE_STATUS_READY) {
    FormatString<char[17],char_const*,char[68]>
              ((string *)local_38,(Diligent *)"Pipeline state \'",(char (*) [17])&this->m_Desc,
               (char **)"\' is not ready. Use GetStatus() to check the pipeline state status.",
               (char (*) [68])in_R8);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GetPatchedShaderCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1d7);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = IsPowerOfTwo<Diligent::ARCHIVE_DEVICE_DATA_FLAGS>(msg.field_2._12_4_);
  if (!bVar1) {
    FormatString<char[41]>
              ((string *)local_68,(char (*) [41])"Only single device data flag is expected");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GetPatchedShaderCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1d8);
    std::__cxx11::string::~string((string *)local_68);
  }
  ShaderCreateInfo::ShaderCreateInfo(__return_storage_ptr__);
  DVar3 = ArchiveDeviceDataFlagToArchiveDeviceType(msg.field_2._12_4_);
  this_01 = std::
            array<std::vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>,_7UL>
            ::operator[](&(this->m_Data).Shaders,(ulong)DVar3);
  uVar5 = (ulong)(uint)msg.field_2._8_4_;
  sVar6 = std::
          vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
          ::size(this_01);
  if (uVar5 < sVar6) {
    Data = std::
           vector<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
           ::operator[](this_01,(ulong)(uint)msg.field_2._8_4_);
    Serializer<(Diligent::SerializerMode)0>::Serializer
              ((Serializer<(Diligent::SerializerMode)0> *)&Ser_1.m_Ptr,&Data->Data);
    ShaderSerializer<(Diligent::SerializerMode)0>::SerializeCI
              ((Serializer<(Diligent::SerializerMode)0> *)&Ser_1.m_Ptr,__return_storage_ptr__);
    if ((DVar3 == Metal_MacOS) || (DVar3 == Metal_iOS)) {
      this_00 = (SerializedData *)((long)&msg_2.field_2 + 8);
      SerializedData::SerializedData
                (this_00,__return_storage_ptr__->ByteCode,
                 (__return_storage_ptr__->field_4).SourceLength);
      Serializer<(Diligent::SerializerMode)0>::Serializer
                ((Serializer<(Diligent::SerializerMode)0> *)local_a8,this_00);
      SerializedData::~SerializedData((SerializedData *)((long)&msg_2.field_2 + 8));
      Serializer<(Diligent::SerializerMode)0>::SerializeBytes
                ((Serializer<(Diligent::SerializerMode)0> *)local_a8,
                 &__return_storage_ptr__->ByteCode,&(__return_storage_ptr__->field_4).SourceLength,8
                );
    }
  }
  else {
    FormatString<char[15],unsigned_int,char[73]>
              ((string *)local_e8,(Diligent *)"Shader index (",
               (char (*) [15])((long)&msg.field_2 + 8),
               (uint *)") is out of range. Call GetPatchedShaderCount() to get the shader count.",
               in_R8);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"GetPatchedShaderCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/SerializedPipelineStateImpl.cpp"
               ,0x1ed);
    std::__cxx11::string::~string((string *)local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderCreateInfo DILIGENT_CALL_TYPE SerializedPipelineStateImpl::GetPatchedShaderCreateInfo(
    ARCHIVE_DEVICE_DATA_FLAGS DeviceType,
    Uint32                    ShaderIndex) const
{
    DEV_CHECK_ERR(m_Status.load() == PIPELINE_STATE_STATUS_READY, "Pipeline state '", m_Desc.Name, "' is not ready. Use GetStatus() to check the pipeline state status.");
    DEV_CHECK_ERR(IsPowerOfTwo(DeviceType), "Only single device data flag is expected");

    ShaderCreateInfo ShaderCI;

    const auto  Type    = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceType);
    const auto& Shaders = m_Data.Shaders[static_cast<size_t>(Type)];
    if (ShaderIndex < Shaders.size())
    {
        {
            Serializer<SerializerMode::Read> Ser{Shaders[ShaderIndex].Data};
            ShaderSerializer<SerializerMode::Read>::SerializeCI(Ser, ShaderCI);
        }
        if (Type == DeviceType::Metal_MacOS || Type == DeviceType::Metal_iOS)
        {
            // See DeviceObjectArchiveMtlImpl::UnpackShader and ShaderMtlSerializer<>::SerializeSource
            Serializer<SerializerMode::Read> Ser{SerializedData{const_cast<void*>(ShaderCI.ByteCode), ShaderCI.ByteCodeSize}};
            Ser.SerializeBytes(ShaderCI.ByteCode, ShaderCI.ByteCodeSize);
        }
    }
    else
    {
        DEV_ERROR("Shader index (", ShaderIndex, ") is out of range. Call GetPatchedShaderCount() to get the shader count.");
    }

    return ShaderCI;
}